

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O2

int VP8IteratorNext(VP8EncIterator *it)

{
  int iVar1;
  
  iVar1 = it->x + 1;
  it->x = iVar1;
  if (iVar1 == it->enc->mb_w) {
    iVar1 = it->y + 1;
    it->y = iVar1;
    VP8IteratorSetRow(it,iVar1);
  }
  else {
    it->mb = it->mb + 1;
    it->preds = it->preds + 4;
    it->nz = it->nz + 1;
    it->y_top = it->y_top + 0x10;
    it->uv_top = it->uv_top + 0x10;
  }
  iVar1 = it->count_down;
  it->count_down = iVar1 + -1;
  return (uint)(1 < iVar1);
}

Assistant:

int VP8IteratorNext(VP8EncIterator* const it) {
  if (++it->x == it->enc->mb_w) {
    VP8IteratorSetRow(it, ++it->y);
  } else {
    it->preds += 4;
    it->mb += 1;
    it->nz += 1;
    it->y_top += 16;
    it->uv_top += 16;
  }
  return (0 < --it->count_down);
}